

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall CLI::Option::type_size(Option *this,int type_size)

{
  int type_size_local;
  Option *this_local;
  
  this->type_size_ = type_size;
  if (this->type_size_ == 0) {
    (this->super_OptionBase<CLI::Option>).required_ = false;
  }
  if (type_size < 0) {
    this->expected_ = -1;
  }
  return this;
}

Assistant:

Option *type_size(int type_size) {
        type_size_ = type_size;
        if(type_size_ == 0)
            required_ = false;
        if(type_size < 0)
            expected_ = -1;
        return this;
    }